

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_builder.c
# Opt level: O1

void builder_generateCode
               (FILE *out,pattern_match_t *matches,pattern_analyse_t *analysation,_Bool returnString
               )

{
  _Bool _Var1;
  int iVar2;
  undefined7 in_register_00000009;
  size_t __size;
  char *__format;
  char *pcVar3;
  
  if ((int)CONCAT71(in_register_00000009,returnString) != 0) {
    if (analysation->hasFloat == true) {
      pcVar3 = 
      "__internal_hfunction->floatToString(__internal_expressionString, EXPR_STRING_LENGTH, ";
      __size = 0x55;
    }
    else {
      if ((analysation->hasInt == false) && (analysation->hasEquation != true)) goto LAB_00105852;
      pcVar3 = "__internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH, "
      ;
      __size = 0x53;
    }
    fwrite(pcVar3,__size,1,(FILE *)out);
  }
LAB_00105852:
  if (matches != (pattern_match_t *)0x0) {
    do {
      switch(matches->type) {
      case INT:
      case FLOAT:
      case OPERATOR:
        pcVar3 = matches->string;
LAB_0010587c:
        fputs(pcVar3,(FILE *)out);
        break;
      case STRING:
        _Var1 = builder_buildStringCompare(out,matches);
        if (!_Var1) {
          pcVar3 = matches->string;
          __format = "\"%s\"";
          goto LAB_0010593e;
        }
LAB_001058b5:
        matches = matches->next->next;
        break;
      case VARIABLE:
        if (analysation->hasFloat == false) {
          if (analysation->hasInt == false) {
            if (analysation->hasOperator != false) break;
            _Var1 = builder_buildStringCompare(out,matches);
            if (_Var1) goto LAB_001058b5;
            pcVar3 = matches->string;
            __format = "getVariable(__internal_mfunction, __internal_root, \"%s\")";
          }
          else {
            pcVar3 = matches->string;
            __format = "atol(getVariable(__internal_mfunction, __internal_root, \"%s\"))";
          }
        }
        else {
          pcVar3 = matches->string;
          __format = "atof(getVariable(__internal_mfunction, __internal_root, \"%s\"))";
        }
LAB_0010593e:
        fprintf((FILE *)out,__format,pcVar3);
        break;
      case EQUATION:
        pcVar3 = matches->string;
        iVar2 = strncmp(pcVar3,"eq",2);
        if (iVar2 == 0) {
          pcVar3 = "==";
        }
        else {
          iVar2 = strncmp(pcVar3,"ne",2);
          if (iVar2 != 0) goto LAB_0010587c;
          pcVar3 = "!=";
        }
        fwrite(pcVar3,2,1,(FILE *)out);
        break;
      case POPEN:
        iVar2 = 0x28;
        goto LAB_00105910;
      case PCLOSE:
        iVar2 = 0x29;
        goto LAB_00105910;
      case NOT:
        iVar2 = 0x21;
LAB_00105910:
        fputc(iVar2,(FILE *)out);
      }
      matches = matches->next;
    } while (matches != (s_pattern_match *)0x0);
  }
  if ((returnString) &&
     (((analysation->hasFloat != false || (analysation->hasInt != false)) ||
      (analysation->hasEquation == true)))) {
    fputc(0x29,(FILE *)out);
    return;
  }
  return;
}

Assistant:

void builder_generateCode(FILE *out, pattern_match_t *matches, pattern_analyse_t *analysation, bool returnString) {

	if ( returnString ) {
		if ( analysation->hasFloat ) {
			fprintf(out, "__internal_hfunction->floatToString(__internal_expressionString, EXPR_STRING_LENGTH, ");
		} else if ( analysation->hasInt || analysation->hasEquation ) {
			fprintf(out, "__internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH, ");
		}
	}

	while ( matches != NULL ) {
		if ( matches->type == VARIABLE ) {
			matches = builder_buildVariable(out, matches, analysation);
		} else if ( matches->type == STRING ) {
			if ( builder_buildStringCompare(out, matches) ) {
				matches = matches->next->next;
			} else {
				fprintf(out, "\"%s\"", matches->string);
			}
		} else if ( matches->type == EQUATION ) {
			if ( !strncmp(matches->string, "eq", 2) ) {
				fprintf(out, "==");
			} else if ( !strncmp(matches->string, "ne", 2) ) {
				fprintf(out, "!=");
			} else {
				fprintf(out, "%s", matches->string);
			}
		} else if ( matches->type == INT ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == FLOAT ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == OPERATOR ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == POPEN ) {
			fprintf(out, "(");
		} else if ( matches->type == PCLOSE ) {
			fprintf(out, ")");
		} else if ( matches->type == NOT ) {
			fprintf(out, "!");
		}

		matches = matches->next;
	}

	if ( returnString ) {
		if ( analysation->hasFloat ) {
			fprintf(out, ")");
		} else if ( analysation->hasInt || analysation->hasEquation ) {
			fprintf(out, ")");
		}
	}
}